

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O3

void insertintohashmap(vector<int,_std::allocator<int>_> *qu,int offset,int d,int tsid,int len,
                      int start)

{
  int iVar1;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this;
  int *__args;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  point f;
  int local_5c;
  key_type local_58;
  long local_38;
  
  local_58.d = PAA_DIMENSION[d];
  local_38 = (long)tsid;
  if ((long)local_58.d < 1) {
    dVar7 = 0.0;
  }
  else {
    iVar1 = (int)((long)len / (long)local_58.d);
    iVar3 = start + iVar1 * offset;
    dVar7 = 0.0;
    lVar4 = 0;
    do {
      if (0 < iVar1) {
        uVar5 = (long)len / (long)local_58.d & 0xffffffff;
        iVar2 = iVar3;
        do {
          dVar8 = (((double)(qu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[offset + lVar4] + 0.5) * bucket_w +
                  min_data) -
                  data_x.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_38].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2];
          dVar7 = dVar7 + dVar8 * dVar8;
          iVar2 = iVar2 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      lVar4 = lVar4 + 1;
      iVar3 = iVar3 + iVar1;
    } while (lVar4 != local_58.d);
  }
  if (dVar7 / (double)len <= (double)FUZZY * bucket_w * bucket_w) {
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_5c = tsid;
    if (0 < local_58.d) {
      lVar4 = (long)offset << 2;
      lVar6 = 0;
      do {
        __args = (int *)((long)(qu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
        if (local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_58,
                     (iterator)
                     local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,__args);
        }
        else {
          *local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *__args;
          local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 4;
      } while (lVar6 < PAA_DIMENSION[d]);
    }
    this = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
           std::
           map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](tree[d] + label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[local_38],&local_58);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>(this,&local_5c);
    if (local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void insertintohashmap(vector<int> &qu, int offset, int d, int tsid, int len, int start) {
    // PAA window
    int window = len / PAA_DIMENSION[d];
    double distance = 0;
    int s_pos = start + offset * window;
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        for (int j = 0; j < window; ++j) {
            double tmp_dis = paa2ts(qu[offset + i]) - data_x[tsid][s_pos + i * window + j];
            distance += tmp_dis * tmp_dis;
        }
    }
    distance /= len;
    if (distance > bucket_w * bucket_w * FUZZY) {
        return;
    }
    point f;
    f.d = PAA_DIMENSION[d];
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f.push_back(qu[offset + i]);
    }
    tree[d][label[tsid]][f].insert(tsid);
}